

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

BufferSp __thiscall
vkt::SpirVAssembly::createCompositeBuffer<unsigned_int>(SpirVAssembly *this,uint number)

{
  Buffer<unsigned_int> *this_00;
  SharedPtrStateBase *extraout_RDX;
  BufferSp BVar1;
  allocator<unsigned_int> local_31;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  uint local_14;
  SpirVAssembly *pSStack_10;
  uint number_local;
  
  local_14 = number;
  pSStack_10 = this;
  this_00 = (Buffer<unsigned_int> *)operator_new(0x20);
  std::allocator<unsigned_int>::allocator(&local_31);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_30,1,&local_14,&local_31);
  Buffer<unsigned_int>::Buffer(this_00,&local_30);
  de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
            ((SharedPtr<vkt::SpirVAssembly::BufferInterface> *)this,(BufferInterface *)this_00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_30);
  std::allocator<unsigned_int>::~allocator(&local_31);
  BVar1.m_state = extraout_RDX;
  BVar1.m_ptr = (BufferInterface *)this;
  return BVar1;
}

Assistant:

BufferSp createCompositeBuffer(T number)
{
	return BufferSp(new Buffer<T>(vector<T>(1, number)));
}